

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DefaultSkewItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultSkewItemSyntax,slang::syntax::DefaultSkewItemSyntax_const&>
          (BumpAllocator *this,DefaultSkewItemSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  ClockingDirectionSyntax *pCVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  DefaultSkewItemSyntax *pDVar13;
  
  pDVar13 = (DefaultSkewItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefaultSkewItemSyntax *)this->endPtr < pDVar13 + 1) {
    pDVar13 = (DefaultSkewItemSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pDVar13 + 1);
  }
  (pDVar13->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pDVar13->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar13->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pDVar13->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5
  ;
  (pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2268;
  (pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pDVar13->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pDVar13->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d2768;
  uVar6 = (args->keyword).field_0x2;
  NVar7.raw = (args->keyword).numFlags.raw;
  uVar8 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  pCVar4 = (args->direction).ptr;
  TVar9 = (args->semi).kind;
  uVar10 = (args->semi).field_0x2;
  NVar11.raw = (args->semi).numFlags.raw;
  uVar12 = (args->semi).rawLen;
  (pDVar13->keyword).kind = (args->keyword).kind;
  (pDVar13->keyword).field_0x2 = uVar6;
  (pDVar13->keyword).numFlags = (NumericTokenFlags)NVar7.raw;
  (pDVar13->keyword).rawLen = uVar8;
  (pDVar13->keyword).info = pIVar3;
  (pDVar13->direction).ptr = pCVar4;
  (pDVar13->semi).kind = TVar9;
  (pDVar13->semi).field_0x2 = uVar10;
  (pDVar13->semi).numFlags = (NumericTokenFlags)NVar11.raw;
  (pDVar13->semi).rawLen = uVar12;
  (pDVar13->semi).info = (args->semi).info;
  return pDVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }